

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_aggregate_function.cpp
# Opt level: O2

void __thiscall
duckdb::WindowAggregateExecutor::WindowAggregateExecutor
          (WindowAggregateExecutor *this,BoundWindowExpression *wexpr,ClientContext *context,
          WindowSharedExpressions *shared,WindowAggregationMode mode)

{
  _Head_base<0UL,_duckdb::WindowAggregator_*,_false> _Var1;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var2;
  column_t cVar3;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var4;
  bool bVar5;
  ClientConfig *pCVar6;
  pointer pAVar7;
  idx_t iVar8;
  pointer pEVar9;
  unique_ptr<duckdb::AggregateFunction,_std::default_delete<duckdb::AggregateFunction>,_true> *aggr;
  column_t filter_idx;
  WindowSharedExpressions *local_40;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_38;
  
  local_40 = shared;
  if ((wexpr->aggregate).
      super_unique_ptr<duckdb::AggregateFunction,_std::default_delete<duckdb::AggregateFunction>_>.
      _M_t.
      super___uniq_ptr_impl<duckdb::AggregateFunction,_std::default_delete<duckdb::AggregateFunction>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::AggregateFunction_*,_std::default_delete<duckdb::AggregateFunction>_>
      .super__Head_base<0UL,_duckdb::AggregateFunction_*,_false>._M_head_impl !=
      (AggregateFunction *)0x0) {
    pCVar6 = ClientConfig::GetConfig(context);
    if (pCVar6->enable_optimizer == true) {
      pAVar7 = unique_ptr<duckdb::AggregateFunction,_std::default_delete<duckdb::AggregateFunction>,_true>
               ::operator->(&wexpr->aggregate);
      if (pAVar7->distinct_dependent != DISTINCT_DEPENDENT) {
        wexpr->distinct = false;
      }
      pAVar7 = unique_ptr<duckdb::AggregateFunction,_std::default_delete<duckdb::AggregateFunction>,_true>
               ::operator->(&wexpr->aggregate);
      if (pAVar7->order_dependent == ORDER_DEPENDENT) {
        iVar8 = BoundWindowExpression::GetSharedOrders(&wexpr->orders,&wexpr->arg_orders);
        if (iVar8 != ((long)(wexpr->arg_orders).
                            super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                            .
                            super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(wexpr->arg_orders).
                           super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                           .
                           super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                           ._M_impl.super__Vector_impl_data._M_start) / 0x18) goto LAB_00a7b4e1;
      }
      ::std::vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>::clear
                (&(wexpr->arg_orders).
                  super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>)
      ;
    }
  }
LAB_00a7b4e1:
  WindowExecutor::WindowExecutor(&this->super_WindowExecutor,wexpr,context,local_40);
  (this->super_WindowExecutor)._vptr_WindowExecutor =
       (_func_int **)&PTR__WindowAggregateExecutor_017a98f8;
  this->mode = mode;
  (this->aggregator).
  super_unique_ptr<duckdb::WindowAggregator,_std::default_delete<duckdb::WindowAggregator>_>._M_t.
  super___uniq_ptr_impl<duckdb::WindowAggregator,_std::default_delete<duckdb::WindowAggregator>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::WindowAggregator_*,_std::default_delete<duckdb::WindowAggregator>_>
  .super__Head_base<0UL,_duckdb::WindowAggregator_*,_false>._M_head_impl = (WindowAggregator *)0x0;
  (this->filter_ref).super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
  _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
  pCVar6 = ClientConfig::GetConfig(context);
  if ((mode == SEPARATE) || (pCVar6->enable_optimizer == false)) {
    make_uniq<duckdb::WindowNaiveAggregator,duckdb::WindowAggregateExecutor&,duckdb::WindowSharedExpressions&>
              ((duckdb *)&filter_idx,this,local_40);
  }
  else {
    bVar5 = WindowDistinctAggregator::CanAggregate(wexpr);
    if (bVar5) {
      make_uniq<duckdb::WindowDistinctAggregator,duckdb::BoundWindowExpression&,duckdb::WindowSharedExpressions&,duckdb::ClientContext&>
                ((duckdb *)&filter_idx,wexpr,local_40,context);
    }
    else {
      bVar5 = WindowConstantAggregator::CanAggregate(wexpr);
      if (bVar5) {
        make_uniq<duckdb::WindowConstantAggregator,duckdb::BoundWindowExpression&,duckdb::WindowSharedExpressions&,duckdb::ClientContext&>
                  ((duckdb *)&filter_idx,wexpr,local_40,context);
      }
      else {
        bVar5 = WindowCustomAggregator::CanAggregate(wexpr,mode);
        if (bVar5) {
          make_uniq<duckdb::WindowCustomAggregator,duckdb::BoundWindowExpression&,duckdb::WindowSharedExpressions&>
                    ((duckdb *)&filter_idx,wexpr,local_40);
        }
        else {
          bVar5 = WindowSegmentTree::CanAggregate(wexpr);
          if (bVar5) {
            make_uniq<duckdb::WindowSegmentTree,duckdb::BoundWindowExpression&,duckdb::WindowSharedExpressions&>
                      ((duckdb *)&filter_idx,wexpr,local_40);
          }
          else {
            make_uniq<duckdb::WindowNaiveAggregator,duckdb::WindowAggregateExecutor&,duckdb::WindowSharedExpressions&>
                      ((duckdb *)&filter_idx,this,local_40);
          }
        }
      }
    }
  }
  cVar3 = filter_idx;
  filter_idx = 0;
  _Var1._M_head_impl =
       (this->aggregator).
       super_unique_ptr<duckdb::WindowAggregator,_std::default_delete<duckdb::WindowAggregator>_>.
       _M_t.
       super___uniq_ptr_impl<duckdb::WindowAggregator,_std::default_delete<duckdb::WindowAggregator>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::WindowAggregator_*,_std::default_delete<duckdb::WindowAggregator>_>
       .super__Head_base<0UL,_duckdb::WindowAggregator_*,_false>._M_head_impl;
  (this->aggregator).
  super_unique_ptr<duckdb::WindowAggregator,_std::default_delete<duckdb::WindowAggregator>_>._M_t.
  super___uniq_ptr_impl<duckdb::WindowAggregator,_std::default_delete<duckdb::WindowAggregator>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::WindowAggregator_*,_std::default_delete<duckdb::WindowAggregator>_>
  .super__Head_base<0UL,_duckdb::WindowAggregator_*,_false>._M_head_impl = (WindowAggregator *)cVar3
  ;
  if (_Var1._M_head_impl != (WindowAggregator *)0x0) {
    (**(code **)((long)(_Var1._M_head_impl)->_vptr_WindowAggregator + 8))();
    if (filter_idx != 0) {
      (**(code **)(*(long *)filter_idx + 8))();
    }
  }
  if ((wexpr->filter_expr).
      super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
      super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
      super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl != (Expression *)0x0) {
    filter_idx = WindowSharedExpressions::RegisterExpr(&wexpr->filter_expr,&local_40->sink_shared);
    pEVar9 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(&wexpr->filter_expr);
    make_uniq<duckdb::BoundReferenceExpression,duckdb::LogicalType&,unsigned_long_const&>
              ((duckdb *)&local_38,&pEVar9->return_type,&filter_idx);
    _Var4._M_head_impl = local_38._M_head_impl;
    local_38._M_head_impl = (Expression *)0x0;
    _Var2._M_head_impl =
         (this->filter_ref).
         super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
         super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
    (this->filter_ref).
    super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = _Var4._M_head_impl;
    if (_Var2._M_head_impl != (Expression *)0x0) {
      (**(code **)(*(long *)&(_Var2._M_head_impl)->super_BaseExpression + 8))();
      if (local_38._M_head_impl != (Expression *)0x0) {
        (**(code **)(*(long *)local_38._M_head_impl + 8))();
      }
    }
  }
  return;
}

Assistant:

WindowAggregateExecutor::WindowAggregateExecutor(BoundWindowExpression &wexpr, ClientContext &context,
                                                 WindowSharedExpressions &shared, WindowAggregationMode mode)
    : WindowExecutor(SimplifyWindowedAggregate(wexpr, context), context, shared), mode(mode) {

	// Force naive for SEPARATE mode or for (currently!) unsupported functionality
	if (!ClientConfig::GetConfig(context).enable_optimizer || mode == WindowAggregationMode::SEPARATE) {
		aggregator = make_uniq<WindowNaiveAggregator>(*this, shared);
	} else if (WindowDistinctAggregator::CanAggregate(wexpr)) {
		// build a merge sort tree
		// see https://dl.acm.org/doi/pdf/10.1145/3514221.3526184
		aggregator = make_uniq<WindowDistinctAggregator>(wexpr, shared, context);
	} else if (WindowConstantAggregator::CanAggregate(wexpr)) {
		aggregator = make_uniq<WindowConstantAggregator>(wexpr, shared, context);
	} else if (WindowCustomAggregator::CanAggregate(wexpr, mode)) {
		aggregator = make_uniq<WindowCustomAggregator>(wexpr, shared);
	} else if (WindowSegmentTree::CanAggregate(wexpr)) {
		// build a segment tree for frame-adhering aggregates
		// see http://www.vldb.org/pvldb/vol8/p1058-leis.pdf
		aggregator = make_uniq<WindowSegmentTree>(wexpr, shared);
	} else {
		// No accelerator can handle this combination, so fall back to naïve.
		aggregator = make_uniq<WindowNaiveAggregator>(*this, shared);
	}

	// Compute the FILTER with the other eval columns.
	// Anyone who needs it can then convert it to the form they need.
	if (wexpr.filter_expr) {
		const auto filter_idx = shared.RegisterSink(wexpr.filter_expr);
		filter_ref = make_uniq<BoundReferenceExpression>(wexpr.filter_expr->return_type, filter_idx);
	}
}